

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZQuadSphere.h
# Opt level: O3

TPZFMatrix<Fad<double>_> * __thiscall
pzgeom::TPZQuadSphere<pzgeom::TPZGeoQuad>::TensorProd<Fad<double>>
          (TPZFMatrix<Fad<double>_> *__return_storage_ptr__,TPZQuadSphere<pzgeom::TPZGeoQuad> *this,
          TPZFMatrix<Fad<double>_> *vec1,TPZFMatrix<Fad<double>_> *vec2)

{
  int j;
  long lVar1;
  long lVar2;
  Fad<double> *pFVar3;
  long lVar4;
  TPZFNMatrix<9,_Fad<double>_> res;
  undefined1 local_220 [16];
  double *local_210;
  double dStack_208;
  TPZFNMatrix<9,_Fad<double>_> local_200;
  
  local_220._0_8_ = (Fad<double> *)0x0;
  local_220._8_8_ = local_220._8_8_ & 0xffffffff00000000;
  local_210 = (double *)0x0;
  dStack_208 = 0.0;
  TPZFNMatrix<9,_Fad<double>_>::TPZFNMatrix(&local_200,3,3,(Fad<double> *)local_220);
  Fad<double>::~Fad((Fad<double> *)local_220);
  lVar4 = 0;
  do {
    lVar2 = 0;
    lVar1 = 0;
    do {
      if (((this->super_TPZGeoQuad).super_TPZNodeRep<4,_pztopology::TPZQuadrilateral>.fNodeIndexes
           [0] <= lVar4) ||
         ((this->super_TPZGeoQuad).super_TPZNodeRep<4,_pztopology::TPZQuadrilateral>.fNodeIndexes[1]
          < 1)) {
        TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      pFVar3 = (Fad<double> *)
               ((this->super_TPZGeoQuad).super_TPZNodeRep<4,_pztopology::TPZQuadrilateral>.
                fNodeIndexes[3] + lVar4 * 0x20);
      if (((vec1->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow <= lVar1) ||
         ((vec1->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      local_220._8_8_ = (long)&vec1->fElem->val_ + lVar2;
      local_220._0_8_ = pFVar3;
      if ((local_200.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
           super_TPZBaseMatrix.fRow <= lVar4) ||
         (local_200.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix
          .fCol <= lVar1)) {
        TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      Fad<double>::operator=
                (local_200.super_TPZFMatrix<Fad<double>_>.fElem +
                 local_200.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
                 super_TPZBaseMatrix.fRow * lVar1 + lVar4,
                 (FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)local_220);
      lVar1 = lVar1 + 1;
      lVar2 = lVar2 + 0x20;
    } while (lVar1 != 3);
    lVar4 = lVar4 + 1;
    if (lVar4 == 3) {
      TPZFMatrix<Fad<double>_>::TPZFMatrix
                (__return_storage_ptr__,&local_200.super_TPZFMatrix<Fad<double>_>);
      local_200.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
      super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZFNMatrix_0184f778;
      lVar4 = 0x1b0;
      do {
        Fad<double>::~Fad((Fad<double> *)
                          ((long)&((TPZFMatrix<Fad<double>_> *)
                                  (&((TPZFMatrix<Fad<double>_> *)
                                    (&local_200.super_TPZFMatrix<Fad<double>_>.fPivot + -1))->fPivot
                                  + -1))->fPivot + lVar4 + 0xffffffffffffffc8U));
        lVar4 = lVar4 + -0x20;
      } while (lVar4 != 0x70);
      TPZFMatrix<Fad<double>_>::~TPZFMatrix
                (&local_200.super_TPZFMatrix<Fad<double>_>,&PTR_PTR_0184fa30);
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

static TPZFMatrix<T> TensorProd(TPZFMatrix<T> &vec1, TPZFMatrix<T> &vec2)
        {
            TPZFNMatrix<9,T> res(3,3,0.);
            for (int i = 0; i < 3; i++) {
                for (int j = 0; j < 3; j++) {
                    res(i,j) = vec1(i,0) * vec2(j,0);
                }
            }
            return res;
        }